

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall
Json::OurReader::getLocationLineAndColumn(OurReader *this,Location location,int *line,int *column)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar3 = this->begin_;
  *line = 0;
  if (pcVar3 < location) {
    iVar1 = 0;
    pcVar4 = pcVar3;
    do {
      iVar2 = (int)pcVar3;
      if (pcVar4 == this->end_) break;
      pcVar5 = pcVar4 + 1;
      if (*pcVar4 == '\n') {
LAB_0012cd4b:
        iVar1 = iVar1 + 1;
        *line = iVar1;
        pcVar3 = pcVar5;
      }
      else if (*pcVar4 == '\r') {
        if ((pcVar5 != this->end_) && (pcVar4[1] == '\n')) {
          pcVar5 = pcVar4 + 2;
        }
        goto LAB_0012cd4b;
      }
      iVar2 = (int)pcVar3;
      pcVar4 = pcVar5;
    } while (pcVar5 < location);
  }
  else {
    iVar2 = (int)pcVar3;
  }
  *column = ((int)location - iVar2) + 1;
  *line = *line + 1;
  return;
}

Assistant:

void OurReader::getLocationLineAndColumn(Location location, int& line,
                                         int& column) const {
  Location current = begin_;
  Location lastLineStart = current;
  line = 0;
  while (current < location && current != end_) {
    Char c = *current++;
    if (c == '\r') {
      if (current != end_ && *current == '\n')
        ++current;
      lastLineStart = current;
      ++line;
    } else if (c == '\n') {
      lastLineStart = current;
      ++line;
    }
  }
  // column & line start at 1
  column = int(location - lastLineStart) + 1;
  ++line;
}